

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexCompleteness(DWARFVerifier *this,DWARFDie *Die,NameIndex *NI)

{
  NameIndex *this_00;
  bool bVar1;
  Tag TVar2;
  uint64_t uVar3;
  DWARFUnit *this_01;
  uint64_t uVar4;
  iterator pSVar5;
  raw_ostream *this_02;
  uint uVar6;
  bool local_401;
  Tag local_3f2;
  uint64_t local_3f0;
  uint64_t local_3e8;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
  local_3e0;
  uint64_t *local_360;
  char *local_358;
  char *pcStack_350;
  iterator_range<llvm::DWARFDebugNames::ValueIterator> local_348;
  undefined1 auStack_148 [8];
  StringRef Name;
  iterator __end1;
  iterator __begin1;
  SmallVector<llvm::StringRef,_2U> *__range1;
  uint64_t DieUnitOffset;
  Attribute local_108 [2];
  uint NumErrors;
  initializer_list<llvm::dwarf::Attribute> local_100;
  ArrayRef<llvm::dwarf::Attribute> local_f0;
  Optional<llvm::DWARFFormValue> local_e0;
  undefined4 local_a8;
  undefined1 local_98 [8];
  SmallVector<llvm::StringRef,_2U> EntryNames;
  undefined1 local_60 [7];
  bool IncludeLinkageName;
  NameIndex *local_28;
  NameIndex *NI_local;
  DWARFDie *Die_local;
  DWARFVerifier *this_local;
  
  local_28 = NI;
  NI_local = (NameIndex *)Die;
  Die_local = (DWARFDie *)this;
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_60,Die,DW_AT_declaration);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)local_60);
  if (bVar1) {
    return 0;
  }
  TVar2 = DWARFDie::getTag((DWARFDie *)NI_local);
  local_401 = true;
  if (TVar2 != DW_TAG_subprogram) {
    TVar2 = DWARFDie::getTag((DWARFDie *)NI_local);
    local_401 = TVar2 == DW_TAG_inlined_subroutine;
  }
  EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer[0xf] = local_401;
  getNames((SmallVector<llvm::StringRef,_2U> *)local_98,(DWARFDie *)NI_local,local_401);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)local_98);
  if (bVar1) {
    this_local._4_4_ = 0;
    goto LAB_0284a9fc;
  }
  TVar2 = DWARFDie::getTag((DWARFDie *)NI_local);
  this_00 = NI_local;
  uVar6 = (uint)TVar2;
  if (TVar2 == DW_TAG_formal_parameter) goto LAB_0284a620;
  if (uVar6 == 8) {
    this_local._4_4_ = 0;
    goto LAB_0284a9fc;
  }
  if (uVar6 == 10) {
LAB_0284a678:
    local_108[0] = DW_AT_low_pc;
    local_108[1] = 0x12;
    NumErrors._0_2_ = 0x55;
    NumErrors._2_2_ = 0x52;
    local_100._M_array = local_108;
    local_100._M_len = 4;
    ArrayRef<llvm::dwarf::Attribute>::ArrayRef(&local_f0,&local_100);
    DWARFDie::findRecursively(&local_e0,(DWARFDie *)this_00,local_f0);
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_e0);
    if (!bVar1) {
      this_local._4_4_ = 0;
      goto LAB_0284a9fc;
    }
    goto LAB_0284a772;
  }
  if (uVar6 == 0xd) {
    this_local._4_4_ = 0;
    goto LAB_0284a9fc;
  }
  if (uVar6 != 0x11) {
    if (uVar6 == 0x1d) goto LAB_0284a678;
    if (uVar6 != 0x1e) {
      if (uVar6 == 0x28) {
        this_local._4_4_ = 0;
        goto LAB_0284a9fc;
      }
      if (uVar6 == 0x2e) goto LAB_0284a678;
      if (uVar6 - 0x2f < 2) {
LAB_0284a620:
        this_local._4_4_ = 0;
      }
      else {
        if (uVar6 == 0x34) {
          bVar1 = isVariableIndexable((DWARFDie *)NI_local,this->DCtx);
          if (!bVar1) {
            this_local._4_4_ = 0;
            goto LAB_0284a9fc;
          }
        }
        else if (uVar6 - 0x4106 < 2) goto LAB_0284a620;
LAB_0284a772:
        DieUnitOffset._4_4_ = 0;
        uVar3 = DWARFDie::getOffset((DWARFDie *)NI_local);
        this_01 = DWARFDie::getDwarfUnit((DWARFDie *)NI_local);
        uVar4 = DWARFUnit::getOffset(this_01);
        __range1 = (SmallVector<llvm::StringRef,_2U> *)(uVar3 - uVar4);
        __end1 = SmallVectorTemplateCommon<llvm::StringRef,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)local_98);
        pSVar5 = SmallVectorTemplateCommon<llvm::StringRef,_void>::end
                           ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)local_98);
        for (; __end1 != pSVar5; __end1 = __end1 + 1) {
          local_358 = __end1->Data;
          pcStack_350 = (char *)__end1->Length;
          auStack_148 = (undefined1  [8])local_358;
          Name.Data = pcStack_350;
          DWARFDebugNames::NameIndex::equal_range(&local_348,local_28,*__end1);
          local_360 = (uint64_t *)&__range1;
          bVar1 = none_of<llvm::iterator_range<llvm::DWARFDebugNames::ValueIterator>,llvm::DWARFVerifier::verifyNameIndexCompleteness(llvm::DWARFDie_const&,llvm::DWARFDebugNames::NameIndex_const&)::__0>
                            (&local_348,(anon_class_8_1_23f945d7_for__M_pred)local_360);
          iterator_range<llvm::DWARFDebugNames::ValueIterator>::~iterator_range(&local_348);
          if (bVar1) {
            this_02 = error(this);
            local_3e8 = DWARFDebugNames::NameIndex::getUnitOffset(local_28);
            local_3f0 = DWARFDie::getOffset((DWARFDie *)NI_local);
            local_3f2 = DWARFDie::getTag((DWARFDie *)NI_local);
            formatv<unsigned_long,_unsigned_long,_llvm::dwarf::Tag,_llvm::StringRef_&>
                      (&local_3e0,
                       "Name Index @ {0:x}: Entry for DIE @ {1:x} ({2}) with name {3} missing.\n",
                       &local_3e8,&local_3f0,&local_3f2,(StringRef *)auStack_148);
            raw_ostream::operator<<(this_02,&local_3e0.super_formatv_object_base);
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
            ::~formatv_object(&local_3e0);
            DieUnitOffset._4_4_ = DieUnitOffset._4_4_ + 1;
          }
        }
        this_local._4_4_ = DieUnitOffset._4_4_;
      }
      goto LAB_0284a9fc;
    }
  }
  this_local._4_4_ = 0;
LAB_0284a9fc:
  local_a8 = 1;
  SmallVector<llvm::StringRef,_2U>::~SmallVector((SmallVector<llvm::StringRef,_2U> *)local_98);
  return this_local._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexCompleteness(
    const DWARFDie &Die, const DWARFDebugNames::NameIndex &NI) {

  // First check, if the Die should be indexed. The code follows the DWARF v5
  // wording as closely as possible.

  // "All non-defining declarations (that is, debugging information entries
  // with a DW_AT_declaration attribute) are excluded."
  if (Die.find(DW_AT_declaration))
    return 0;

  // "DW_TAG_namespace debugging information entries without a DW_AT_name
  // attribute are included with the name “(anonymous namespace)”.
  // All other debugging information entries without a DW_AT_name attribute
  // are excluded."
  // "If a subprogram or inlined subroutine is included, and has a
  // DW_AT_linkage_name attribute, there will be an additional index entry for
  // the linkage name."
  auto IncludeLinkageName = Die.getTag() == DW_TAG_subprogram ||
                            Die.getTag() == DW_TAG_inlined_subroutine;
  auto EntryNames = getNames(Die, IncludeLinkageName);
  if (EntryNames.empty())
    return 0;

  // We deviate from the specification here, which says:
  // "The name index must contain an entry for each debugging information entry
  // that defines a named subprogram, label, variable, type, or namespace,
  // subject to ..."
  // Instead whitelisting all TAGs representing a "type" or a "subprogram", to
  // make sure we catch any missing items, we instead blacklist all TAGs that we
  // know shouldn't be indexed.
  switch (Die.getTag()) {
  // Compile units and modules have names but shouldn't be indexed.
  case DW_TAG_compile_unit:
  case DW_TAG_module:
    return 0;

  // Function and template parameters are not globally visible, so we shouldn't
  // index them.
  case DW_TAG_formal_parameter:
  case DW_TAG_template_value_parameter:
  case DW_TAG_template_type_parameter:
  case DW_TAG_GNU_template_parameter_pack:
  case DW_TAG_GNU_template_template_param:
    return 0;

  // Object members aren't globally visible.
  case DW_TAG_member:
    return 0;

  // According to a strict reading of the specification, enumerators should not
  // be indexed (and LLVM currently does not do that). However, this causes
  // problems for the debuggers, so we may need to reconsider this.
  case DW_TAG_enumerator:
    return 0;

  // Imported declarations should not be indexed according to the specification
  // and LLVM currently does not do that.
  case DW_TAG_imported_declaration:
    return 0;

  // "DW_TAG_subprogram, DW_TAG_inlined_subroutine, and DW_TAG_label debugging
  // information entries without an address attribute (DW_AT_low_pc,
  // DW_AT_high_pc, DW_AT_ranges, or DW_AT_entry_pc) are excluded."
  case DW_TAG_subprogram:
  case DW_TAG_inlined_subroutine:
  case DW_TAG_label:
    if (Die.findRecursively(
            {DW_AT_low_pc, DW_AT_high_pc, DW_AT_ranges, DW_AT_entry_pc}))
      break;
    return 0;

  // "DW_TAG_variable debugging information entries with a DW_AT_location
  // attribute that includes a DW_OP_addr or DW_OP_form_tls_address operator are
  // included; otherwise, they are excluded."
  //
  // LLVM extension: We also add DW_OP_GNU_push_tls_address to this list.
  case DW_TAG_variable:
    if (isVariableIndexable(Die, DCtx))
      break;
    return 0;

  default:
    break;
  }

  // Now we know that our Die should be present in the Index. Let's check if
  // that's the case.
  unsigned NumErrors = 0;
  uint64_t DieUnitOffset = Die.getOffset() - Die.getDwarfUnit()->getOffset();
  for (StringRef Name : EntryNames) {
    if (none_of(NI.equal_range(Name), [&](const DWARFDebugNames::Entry &E) {
          return E.getDIEUnitOffset() == DieUnitOffset;
        })) {
      error() << formatv("Name Index @ {0:x}: Entry for DIE @ {1:x} ({2}) with "
                         "name {3} missing.\n",
                         NI.getUnitOffset(), Die.getOffset(), Die.getTag(),
                         Name);
      ++NumErrors;
    }
  }
  return NumErrors;
}